

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O1

UniquePtr<SSL_CREDENTIAL>
ssl_credential_new_spake2plusv1
          (SSLCredentialType type,Span<const_unsigned_char> context,
          Span<const_unsigned_char> client_identity,Span<const_unsigned_char> server_identity,
          uint32_t limit)

{
  size_t new_size;
  bool bVar1;
  uchar *new_size_00;
  Array<unsigned_char> *pAVar2;
  undefined4 in_register_0000003c;
  __uniq_ptr_data<ssl_credential_st,_bssl::internal::Deleter,_true,_true> _Var3;
  undefined4 in_register_0000008c;
  ptrdiff_t _Num;
  ptrdiff_t _Num_1;
  UniquePtr<ssl_credential_st> cred;
  __int_type in_stack_00000018;
  _Head_base<0UL,_ssl_credential_st_*,_false> local_48;
  SSLCredentialType local_3c;
  void *local_38;
  
  _Var3.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl._4_4_ = in_register_0000003c;
  _Var3.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl._0_4_ = type;
  new_size_00 = client_identity.data_;
  local_3c = (SSLCredentialType)context.data_;
  if ((local_3c & ~kDelegated) != kSPAKE2PlusV1Client) {
    __assert_fail("type == SSLCredentialType::kSPAKE2PlusV1Client || type == SSLCredentialType::kSPAKE2PlusV1Server"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                  ,499,
                  "UniquePtr<SSL_CREDENTIAL> ssl_credential_new_spake2plusv1(SSLCredentialType, Span<const uint8_t>, Span<const uint8_t>, Span<const uint8_t>, uint32_t)"
                 );
  }
  new_size = CONCAT44(in_register_0000008c,limit);
  local_48._M_head_impl = bssl::New<ssl_credential_st,bssl::SSLCredentialType&>(&local_3c);
  if (local_48._M_head_impl != (ssl_credential_st *)0x0) {
    pAVar2 = &(local_48._M_head_impl)->pake_context;
    local_38 = (void *)client_identity.size_;
    bVar1 = bssl::Array<unsigned_char>::InitUninitialized(pAVar2,(size_t)new_size_00);
    if (bVar1 && new_size_00 != (uchar *)0x0) {
      memmove(pAVar2->data_,(void *)context.size_,(size_t)new_size_00);
    }
    if (bVar1) {
      pAVar2 = &(local_48._M_head_impl)->client_identity;
      bVar1 = bssl::Array<unsigned_char>::InitUninitialized(pAVar2,new_size);
      if (bVar1 && new_size != 0) {
        memmove(pAVar2->data_,local_38,new_size);
      }
      if (bVar1) {
        pAVar2 = &(local_48._M_head_impl)->server_identity;
        bVar1 = bssl::Array<unsigned_char>::InitUninitialized(pAVar2,server_identity.size_);
        if (bVar1 && server_identity.size_ != 0) {
          memmove(pAVar2->data_,server_identity.data_,server_identity.size_);
        }
        if (bVar1) {
          LOCK();
          ((local_48._M_head_impl)->pake_limit).super___atomic_base<unsigned_int>._M_i =
               in_stack_00000018;
          UNLOCK();
          *(ssl_credential_st **)
           _Var3.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl = local_48._M_head_impl;
          local_48._M_head_impl = (ssl_credential_st *)0x0;
          goto LAB_0015344e;
        }
      }
    }
  }
  *(undefined8 *)
   _Var3.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
   super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
   super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl = 0;
LAB_0015344e:
  std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)&local_48);
  return (__uniq_ptr_data<ssl_credential_st,_bssl::internal::Deleter,_true,_true>)
         (tuple<ssl_credential_st_*,_bssl::internal::Deleter>)
         _Var3.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl;
}

Assistant:

static UniquePtr<SSL_CREDENTIAL> ssl_credential_new_spake2plusv1(
    SSLCredentialType type, Span<const uint8_t> context,
    Span<const uint8_t> client_identity, Span<const uint8_t> server_identity,
    uint32_t limit) {
  assert(type == SSLCredentialType::kSPAKE2PlusV1Client ||
         type == SSLCredentialType::kSPAKE2PlusV1Server);
  auto cred = MakeUnique<SSL_CREDENTIAL>(type);
  if (cred == nullptr) {
    return nullptr;
  }

  if (!cred->pake_context.CopyFrom(context) ||
      !cred->client_identity.CopyFrom(client_identity) ||
      !cred->server_identity.CopyFrom(server_identity)) {
    return nullptr;
  }

  cred->pake_limit.store(limit);
  return cred;
}